

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dmidtex.cpp
# Opt level: O0

bool P_LineOpening_3dMidtex(AActor *thing,line_t *linedef,FLineOpening *open,bool restrict)

{
  double dVar1;
  unsigned_short uVar2;
  WORD WVar3;
  uint uVar4;
  FTextureID FVar5;
  bool bVar6;
  double local_48;
  double tb;
  double tt;
  TFlags<ActorFlag,_unsigned_int> local_30;
  byte local_29;
  FLineOpening *pFStack_28;
  bool restrict_local;
  FLineOpening *open_local;
  line_t *linedef_local;
  AActor *thing_local;
  
  bVar6 = false;
  local_29 = restrict;
  pFStack_28 = open;
  open_local = (FLineOpening *)linedef;
  linedef_local = (line_t *)thing;
  if ((linedef->flags & 0x10000000) != 0) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_30,(int)thing + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar4 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_30);
    bVar6 = true;
    if (uVar4 == 0) {
      TFlags<ActorBounceFlag,_unsigned_short>::operator&
                ((TFlags<ActorBounceFlag,_unsigned_short> *)((long)&tt + 6),
                 (int)linedef_local + (BOUNCE_Quiet|BOUNCE_UseSeeSound|BOUNCE_AutoOff|BOUNCE_Actors)
                );
      uVar2 = TFlags::operator_cast_to_unsigned_short((TFlags *)((long)&tt + 6));
      bVar6 = uVar2 != 0;
    }
  }
  if (!bVar6) {
    pFStack_28->abovemidtex = false;
    bVar6 = P_GetMidTexturePosition((line_t *)open_local,0,&tb,&local_48);
    if (bVar6) {
      dVar1 = AActor::Center((AActor *)linedef_local);
      if ((tb + local_48) / 2.0 <= dVar1) {
        if ((pFStack_28->bottom <= tb && tb != pFStack_28->bottom) &&
           (((local_29 & 1) == 0 || (dVar1 = AActor::Z((AActor *)linedef_local), tb <= dVar1)))) {
          pFStack_28->bottom = tb;
          pFStack_28->abovemidtex = true;
          FVar5 = side_t::GetTexture((side_t *)(open_local->frontfloorplane).normal.Z,1);
          (pFStack_28->floorpic).texnum = FVar5.texnum;
          WVar3 = FTerrainTypeArray::operator[]
                            (&TerrainTypes,(FTextureID)(pFStack_28->floorpic).texnum);
          pFStack_28->floorterrain = (uint)WVar3;
          secplane_t::SetAtHeight(&pFStack_28->frontfloorplane,tb,0);
          secplane_t::SetAtHeight(&pFStack_28->backfloorplane,tb,0);
        }
        dVar1 = AActor::Z((AActor *)linedef_local);
        return ABS(dVar1 - tb) <= *(double *)&linedef_local[6].flags;
      }
      if (local_48 < pFStack_28->top) {
        pFStack_28->top = local_48;
        FVar5 = side_t::GetTexture((side_t *)(open_local->frontfloorplane).normal.Z,1);
        (pFStack_28->ceilingpic).texnum = FVar5.texnum;
      }
    }
  }
  return false;
}

Assistant:

bool P_LineOpening_3dMidtex(AActor *thing, const line_t *linedef, FLineOpening &open, bool restrict)
{
	// [TP] Impassible-like 3dmidtextures do not block missiles
	if ((linedef->flags & ML_3DMIDTEX_IMPASS)
		&& (thing->flags & MF_MISSILE || thing->BounceFlags & BOUNCE_MBF))
	{
		return false;
	}

	double tt, tb;

	open.abovemidtex = false;
	if (P_GetMidTexturePosition(linedef, 0, &tt, &tb))
	{
		if (thing->Center() < (tt + tb)/2)
		{
			if (tb < open.top)
			{
				open.top = tb;
				open.ceilingpic = linedef->sidedef[0]->GetTexture(side_t::mid);
			}
		}
		else
		{
			if (tt > open.bottom && (!restrict || thing->Z() >= tt))
			{
				open.bottom = tt;
				open.abovemidtex = true;
				open.floorpic = linedef->sidedef[0]->GetTexture(side_t::mid);
				open.floorterrain = TerrainTypes[open.floorpic];
				open.frontfloorplane.SetAtHeight(tt, sector_t::floor);
				open.backfloorplane.SetAtHeight(tt, sector_t::floor);

			}
			// returns true if it touches the midtexture
			return (fabs(thing->Z() - tt) <= thing->MaxStepHeight);
		}
	}
	return false;

	/* still have to figure out what this code from Eternity means...
	if((linedef->flags & ML_BLOCKMONSTERS) && 
		!(mo->flags & (MF_FLOAT | MF_DROPOFF)) &&
		fabs(mo->Z() - tt) <= 24)
	{
		opentop = openbottom;
		openrange = 0;
		return;
	}
	*/
}